

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Le
          (PortalImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  array<float,_4> aVar1;
  bool bVar2;
  Float *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  Vector3<float> VVar11;
  Bounds2f BVar12;
  SampledSpectrum SVar13;
  SampledWavelengths *in_stack_00000010;
  Point2f st;
  PortalImageInfiniteLight *in_stack_00000020;
  Vector3f w;
  Float c;
  Tuple2<pbrt::Point2,_float> this_00;
  Tuple2<pbrt::Point2,_float> local_50;
  undefined8 local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Float *duv_dw;
  Vector3f *in_stack_fffffffffffffff0;
  PortalImageInfiniteLight *in_stack_fffffffffffffff8;
  undefined1 extraout_var [56];
  undefined1 auVar10 [56];
  
  auVar10 = in_ZMM1._8_56_;
  auVar7 = in_ZMM0._8_56_;
  duv_dw = in_RDI;
  VVar11 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  c = (Float)((ulong)in_RDI >> 0x20);
  auVar3._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar7;
  local_48 = vmovlpd_avx(auVar3._0_16_);
  auVar4._0_8_ = ImageFromRender(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,duv_dw);
  auVar4._8_56_ = extraout_var;
  local_50 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar4._0_16_);
  auVar7 = extraout_var;
  BVar12 = ImageBounds((PortalImageInfiniteLight *)lambda,stack0x00000038);
  auVar8._0_8_ = BVar12.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar8._8_56_ = auVar10;
  auVar5._0_8_ = BVar12.pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar5._8_56_ = auVar7;
  this_00 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar5._0_16_);
  vmovlpd_avx(auVar8._0_16_);
  bVar2 = Inside<float>((Point2<float> *)&local_50,(Bounds2<float> *)&stack0xffffffffffffffa0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    SVar13 = ImageLookup(in_stack_00000020,(Point2f *)st.super_Tuple2<pbrt::Point2,_float>,
                         in_stack_00000010);
    auVar9._0_8_ = SVar13.values.values._8_8_;
    auVar9._8_56_ = auVar10;
    auVar6._0_8_ = SVar13.values.values._0_8_;
    auVar6._8_56_ = auVar7;
    in_stack_fffffffffffffff0 = (Vector3f *)vmovlpd_avx(auVar6._0_16_);
    in_stack_fffffffffffffff8 = (PortalImageInfiniteLight *)vmovlpd_avx(auVar9._0_16_);
  }
  else {
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)this_00,c);
  }
  aVar1.values._8_8_ = in_stack_fffffffffffffff8;
  aVar1.values._0_8_ = in_stack_fffffffffffffff0;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Le(const Ray &ray,
                                             const SampledWavelengths &lambda) const {
    // Ignore world to light...
    Vector3f w = Normalize(ray.d);
    Point2f st = ImageFromRender(w);

    if (!Inside(st, ImageBounds(ray.o)))
        return SampledSpectrum(0.f);

    return ImageLookup(st, lambda);
}